

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_strategy.cpp
# Opt level: O3

void __thiscall
EscapeStrategy::generateActions(EscapeStrategy *this,PlayerSight *sight,Actions *actions)

{
  Vec2 pos;
  Vec2 pos_00;
  bool bVar1;
  Randomizer *this_00;
  Router *this_01;
  long lVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if (this->field_0xc != '\0') {
    return;
  }
  fVar8 = (sight->pos).x;
  fVar5 = (sight->pos).y;
  if (0 < this->tries) {
    iVar3 = 0;
    fVar9 = fVar5;
    fVar7 = fVar8;
    fVar4 = 0.0;
    do {
      do {
        this_00 = Randomizer::getInstance();
        fVar5 = Randomizer::randXAxis(this_00);
        fVar8 = (fVar5 * 3.1415927) / 60.0 + 3.1415927;
        fVar5 = cosf(fVar8);
        fVar6 = sinf(fVar8);
        fVar8 = (sight->pos).x + fVar5 + fVar5;
        fVar5 = (sight->pos).y + fVar6 + fVar6;
        this_01 = Router::getInstance();
        pos_00.y = fVar5;
        pos_00.x = fVar8;
        bVar1 = Router::Reachable(this_01,pos_00);
      } while (bVar1);
      lVar2 = *(long *)&sight->unitInSight;
      if (lVar2 == *(long *)&sight->field_0x80) {
        fVar6 = 0.0;
      }
      else {
        fVar6 = 0.0;
        do {
          fVar10 = *(float *)(lVar2 + 4) - (sight->pos).x;
          fVar11 = *(float *)(lVar2 + 8) - (sight->pos).y;
          fVar10 = SQRT(fVar10 * fVar10 + fVar11 * fVar11);
          if (fVar10 < 0.0001) {
            fVar6 = 1e+08;
            break;
          }
          fVar6 = fVar6 + 1.0 / fVar10;
          lVar2 = lVar2 + 0x14;
        } while (lVar2 != *(long *)&sight->field_0x80);
      }
      if (fVar4 <= fVar6) {
        fVar6 = fVar4;
        fVar5 = fVar9;
        fVar8 = fVar7;
      }
      iVar3 = iVar3 + 1;
      fVar9 = fVar5;
      fVar7 = fVar8;
      fVar4 = fVar6;
    } while (iVar3 < this->tries);
  }
  pos.y = fVar5;
  pos.x = fVar8;
  Actions::emplace(actions,SelectDestination,sight->id,pos);
  return;
}

Assistant:

void EscapeStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    Vec2 best(sight.pos);
    float best_score = 0;
    for (int i = 0; i < tries; ++i)
    {
        Vec2 goal;
        do          //使用Randomizer的AxisRnd，通过变换生成一个均匀分布在(0, 2π)的随机角度
        {
            float rad = (Randomizer::getInstance()->randXAxis()) * PI / MapWidth + PI;
            Vec2 e0(cos(rad), sin(rad));
            goal = sight.pos + e0 * PlayerVelocity;
        } while (Router::getInstance()->Reachable(goal));
        float score = 0;
        for (auto uinfo : sight.unitInSight)
        {
            float dis = (uinfo.pos - sight.pos).length();
            if (dis < EPS)
            {
                score = FINF;
                break;
            }
            score += 1 / dis;
        }
        if (score < best_score)
        {
            best_score = score;
            best = goal;
        }
    }
    actions->emplace(SelectDestination, sight.id, best);
}